

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_A_FastChase
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AActor *actor;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00400df9;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    actor = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (actor != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00400df9;
        }
        goto LAB_00400dc0;
      }
    }
    else if (actor != (AActor *)0x0) goto LAB_00400de9;
    actor = (AActor *)0x0;
LAB_00400dc0:
    A_DoChase(actor,true,actor->MeleeState,actor->MissileState,true,true,false,0);
    return 0;
  }
LAB_00400de9:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00400df9:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xb81,
                "int AF_AActor_A_FastChase(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FastChase)
{
	PARAM_SELF_PROLOGUE(AActor);
	A_DoChase(self, true, self->MeleeState, self->MissileState, true, true, false, 0);
	return 0;
}